

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2cfb1b::ArchiveTool::configureAttribute
          (ArchiveTool *this,ConfigureContext *ctx,StringRef name,ArrayRef<llvm::StringRef> values)

{
  StringRef local_78;
  Twine local_68;
  Twine local_50;
  Twine local_38;
  
  local_78.Length = name.Length;
  local_78.Data = name.Data;
  llvm::Twine::Twine(&local_50,"unexpected attribute: \'",&local_78);
  llvm::Twine::Twine(&local_68,"\'");
  llvm::Twine::concat(&local_38,&local_50,&local_68);
  llbuild::buildsystem::ConfigureContext::error(ctx,&local_38);
  return false;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  ArrayRef<StringRef> values) override {
    // No supported attributes.
    ctx.error("unexpected attribute: '" + name + "'");
    return false;
  }